

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::generate_training_example
               (search_private *priv,polylabel *losses,float weight,bool add_conditioning,
               float min_loss)

{
  uint64_t *puVar1;
  byte bVar2;
  wclass *pwVar3;
  example *peVar4;
  uchar *puVar5;
  size_t sVar6;
  bool bVar7;
  wclass *pwVar8;
  multi_learner *pmVar9;
  label_t lVar10;
  ulong uVar11;
  single_learner *psVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint32_t uVar17;
  uint64_t uVar18;
  wclass *pwVar19;
  search_private *psVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  example *ec;
  bool bVar24;
  bool bVar25;
  multi_ex tmp;
  label_t local_a8;
  label_t lStack_a0;
  label_t local_98;
  size_t sStack_90;
  size_t local_88;
  polylabel *local_78;
  ulong local_70;
  wclass local_68;
  long local_58;
  ulong local_50;
  uint64_t local_48;
  ulong local_40;
  ulong local_38;
  
  pwVar8 = (losses->cs).costs._begin;
  pwVar3 = (losses->cs).costs._end;
  if (priv->cb_learner == true) {
    if ((min_loss == 3.4028235e+38) && (!NAN(min_loss))) {
      if ((long)pwVar3 - (long)pwVar8 == 0) {
        min_loss = 3.4028235e+38;
      }
      else {
        lVar14 = (long)pwVar3 - (long)pwVar8 >> 4;
        lVar14 = lVar14 + (ulong)(lVar14 == 0);
        min_loss = 3.4028235e+38;
        pwVar19 = pwVar8;
        do {
          if (pwVar19->x <= min_loss) {
            min_loss = pwVar19->x;
          }
          pwVar19 = pwVar19 + 1;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
    }
    if (pwVar3 != pwVar8) {
      lVar14 = 0;
      uVar15 = 0;
      do {
        *(float *)((long)&pwVar8->x + lVar14) = *(float *)((long)&pwVar8->x + lVar14) - min_loss;
        uVar15 = uVar15 + 1;
        pwVar8 = (losses->cs).costs._begin;
        lVar14 = lVar14 + 0x10;
      } while (uVar15 < (ulong)((long)(losses->cs).costs._end - (long)pwVar8 >> 4));
    }
  }
  else {
    if ((min_loss == 3.4028235e+38) && (!NAN(min_loss))) {
      if ((long)pwVar3 - (long)pwVar8 == 0) {
        min_loss = 3.4028235e+38;
      }
      else {
        lVar14 = (long)pwVar3 - (long)pwVar8 >> 4;
        lVar14 = lVar14 + (ulong)(lVar14 == 0);
        min_loss = 3.4028235e+38;
        pwVar19 = pwVar8;
        do {
          if (pwVar19->x <= min_loss) {
            min_loss = pwVar19->x;
          }
          pwVar19 = pwVar19 + 1;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
    }
    if (pwVar3 != pwVar8) {
      lVar14 = 0;
      uVar15 = 0;
      do {
        *(float *)((long)&pwVar8->x + lVar14) =
             (*(float *)((long)&pwVar8->x + lVar14) - min_loss) * weight;
        uVar15 = uVar15 + 1;
        pwVar8 = (losses->cs).costs._begin;
        lVar14 = lVar14 + 0x10;
      } while (uVar15 < (ulong)((long)(losses->cs).costs._end - (long)pwVar8 >> 4));
    }
  }
  peVar4 = priv->learn_ec_ref;
  if (priv->is_ldf == false) {
    local_88 = (peVar4->l).cb_eval.event.costs.erase_count;
    local_a8 = (peVar4->l).multi;
    lStack_a0 = (label_t)(peVar4->l).cs.costs._end;
    local_98 = (label_t)(peVar4->l).cs.costs.end_array;
    sStack_90 = (peVar4->l).cs.costs.erase_count;
    pwVar8 = (losses->cs).costs._end;
    pwVar3 = (losses->cs).costs.end_array;
    sVar6 = (losses->cs).costs.erase_count;
    (peVar4->l).multi = losses->multi;
    (peVar4->l).cs.costs._end = pwVar8;
    (peVar4->l).cs.costs.end_array = pwVar3;
    (peVar4->l).cs.costs.erase_count = sVar6;
    (peVar4->l).cb_eval.event.costs.erase_count = (losses->cb_eval).event.costs.erase_count;
    if (add_conditioning) {
      add_example_conditioning
                (priv,peVar4,
                 (long)(priv->learn_condition_on)._end - (long)(priv->learn_condition_on)._begin >>
                 2,(priv->learn_condition_on_names)._begin,(priv->learn_condition_on_act)._begin);
    }
    bVar2 = priv->xv;
    bVar7 = true;
    bVar24 = false;
    do {
      uVar17 = priv->current_policy;
      if (-1 < (int)uVar17) {
        iVar22 = (int)priv->learn_learner_id;
        if (((bVar2 & 1) != 0) && (iVar22 = iVar22 * 3, bVar7)) {
          iVar22 = iVar22 - ((uint)priv->all->sd->example_number | 0xfffffffe);
        }
        uVar17 = iVar22 + uVar17 * (int)priv->num_learners;
      }
      peVar4->in_use = true;
      psVar12 = LEARNER::as_singleline<char,char>(priv->base_learner);
      puVar1 = &(peVar4->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + (ulong)(*(int *)(psVar12 + 0xe0) * uVar17);
      psVar20 = *(search_private **)(psVar12 + 0x18);
      (**(code **)(psVar12 + 0x28))(psVar20,*(undefined8 *)(psVar12 + 0x20),peVar4);
      puVar1 = &(peVar4->super_example_predict).ft_offset;
      *puVar1 = *puVar1 - (ulong)(uVar17 * *(int *)(psVar12 + 0xe0));
      bVar2 = priv->xv;
      bVar7 = false;
      bVar25 = bVar24 < bVar2;
      bVar24 = true;
    } while (bVar25);
    if (((add_conditioning) &&
        (puVar5 = (peVar4->super_example_predict).indices._end,
        puVar5 != (peVar4->super_example_predict).indices._begin)) && (puVar5[-1] == 0x86)) {
      del_features_in_top_namespace(psVar20,peVar4,0x86);
    }
    (peVar4->l).cb_eval.event.costs.erase_count = local_88;
    (peVar4->l).cs.costs.end_array = (wclass *)local_98;
    (peVar4->l).cs.costs.erase_count = sStack_90;
    (peVar4->l).multi = local_a8;
    (peVar4->l).cs.costs._end = (wclass *)lStack_a0;
    priv->total_examples_generated = priv->total_examples_generated + 1;
  }
  else {
    bVar7 = COST_SENSITIVE::ec_is_example_header(peVar4);
    uVar15 = (ulong)bVar7;
    if ((add_conditioning) && (uVar15 < priv->learn_ec_ref_cnt)) {
      uVar16 = (uint)bVar7;
      uVar21 = uVar15;
      do {
        uVar16 = uVar16 + 1;
        add_example_conditioning
                  (priv,priv->learn_ec_ref + uVar21,
                   (long)(priv->learn_condition_on)._end - (long)(priv->learn_condition_on)._begin
                   >> 2,(priv->learn_condition_on_names)._begin,
                   (priv->learn_condition_on_act)._begin);
        uVar21 = (ulong)uVar16;
      } while ((ulong)uVar16 < priv->learn_ec_ref_cnt);
    }
    uVar11 = (ulong)priv->xv;
    local_70 = (ulong)(bVar7 + 1);
    bVar7 = true;
    uVar21 = 0;
    local_58 = uVar15 * 0x68d0;
    local_78 = losses;
    local_38 = uVar15;
    do {
      uVar16 = priv->current_policy;
      if (-1 < (int)uVar16) {
        iVar22 = (int)priv->learn_learner_id;
        if (((uVar11 & 1) != 0) && (iVar22 = iVar22 * 3, bVar7)) {
          iVar22 = iVar22 - ((uint)priv->all->sd->example_number | 0xfffffffe);
        }
        uVar16 = iVar22 + uVar16 * (int)priv->num_learners;
      }
      local_a8.label = 0;
      local_a8.weight = 0.0;
      lStack_a0.label = 0;
      lStack_a0.weight = 0.0;
      local_98.label = 0;
      local_98.weight = 0.0;
      if (uVar15 < priv->learn_ec_ref_cnt) {
        local_48 = *(uint64_t *)
                    ((long)&(priv->learn_ec_ref->super_example_predict).ft_offset + local_58);
        uVar23 = 0;
        local_50 = (ulong)uVar16;
        local_40 = uVar21;
        do {
          peVar4 = priv->learn_ec_ref;
          pwVar8 = peVar4[uVar15].l.cs.costs._begin;
          if (peVar4[uVar15].l.cs.costs._end == pwVar8) {
            local_68._0_8_ = (ulong)uVar23 << 0x20;
            local_68.partial_prediction = 0.0;
            local_68.wap_value = 0.0;
            v_array<COST_SENSITIVE::wclass>::push_back
                      ((v_array<COST_SENSITIVE::wclass> *)&peVar4[uVar15].l.simple,&local_68);
            pwVar8 = peVar4[uVar15].l.cs.costs._begin;
            losses = local_78;
          }
          uVar11 = local_38;
          local_68._0_8_ = peVar4 + uVar15;
          pwVar8->x = (losses->cs).costs._begin[uVar15 - local_38].x;
          ((example *)local_68._0_8_)->in_use = true;
          (((example *)local_68._0_8_)->super_example_predict).ft_offset = priv->offset;
          if (lStack_a0 == local_98) {
            std::vector<example*,std::allocator<example*>>::_M_realloc_insert<example*>
                      ((vector<example*,std::allocator<example*>> *)&local_a8,(iterator)lStack_a0,
                       (example **)&local_68);
          }
          else {
            *(undefined8 *)lStack_a0 = local_68._0_8_;
            lStack_a0 = (label_t)((long)lStack_a0 + 8);
          }
          priv->total_examples_generated = priv->total_examples_generated + 1;
          uVar15 = (ulong)((int)local_70 + uVar23);
          uVar23 = uVar23 + 1;
        } while (uVar15 < priv->learn_ec_ref_cnt);
        uVar16 = (uint)local_50;
        uVar18 = local_48;
        uVar21 = local_40;
        uVar15 = uVar11;
      }
      else {
        uVar18 = 0;
      }
      pmVar9 = LEARNER::as_multiline<char,char>(priv->base_learner);
      if (local_a8 != lStack_a0) {
        iVar22 = *(int *)(pmVar9 + 0xe0);
        lVar10 = local_a8;
        do {
          *(ulong *)(*(long *)lVar10 + 0x6820) =
               *(long *)(*(long *)lVar10 + 0x6820) + (ulong)(iVar22 * uVar16);
          lVar10 = (label_t)((long)lVar10 + 8);
        } while (lVar10 != lStack_a0);
      }
      (**(code **)(pmVar9 + 0x28))
                (*(undefined8 *)(pmVar9 + 0x18),*(undefined8 *)(pmVar9 + 0x20),&local_a8);
      losses = local_78;
      if (local_a8 != lStack_a0) {
        iVar22 = *(int *)(pmVar9 + 0xe0);
        lVar10 = local_a8;
        do {
          *(ulong *)(*(long *)lVar10 + 0x6820) =
               *(long *)(*(long *)lVar10 + 0x6820) - (ulong)(uVar16 * iVar22);
          lVar10 = (label_t)((long)lVar10 + 8);
        } while (lVar10 != lStack_a0);
      }
      uVar11 = local_70;
      uVar13 = uVar15;
      if (uVar15 < priv->learn_ec_ref_cnt) {
        do {
          priv->learn_ec_ref[uVar13].super_example_predict.ft_offset = uVar18;
          uVar13 = uVar11 & 0xffffffff;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (uVar13 < priv->learn_ec_ref_cnt);
      }
      lVar10 = local_a8;
      if (local_a8 != (label_t)0x0) {
        operator_delete((void *)local_a8);
      }
      uVar11 = (ulong)priv->xv;
      bVar7 = false;
      bVar24 = uVar21 < uVar11;
      uVar21 = 1;
    } while (bVar24);
    uVar21 = priv->learn_ec_ref_cnt;
    if (add_conditioning && uVar15 < uVar21) {
      uVar16 = (uint)uVar15;
      do {
        uVar16 = uVar16 + 1;
        peVar4 = priv->learn_ec_ref;
        puVar5 = peVar4[uVar15].super_example_predict.indices._end;
        if ((puVar5 != peVar4[uVar15].super_example_predict.indices._begin) && (puVar5[-1] == 0x86))
        {
          del_features_in_top_namespace((search_private *)lVar10,peVar4 + uVar15,0x86);
          uVar21 = priv->learn_ec_ref_cnt;
        }
        uVar15 = (ulong)uVar16;
      } while (uVar15 < uVar21);
    }
  }
  return;
}

Assistant:

void generate_training_example(search_private& priv, polylabel& losses, float weight, bool add_conditioning = true,
    float min_loss = FLT_MAX)  // min_loss = FLT_MAX means "please compute it for me as the actual min"; any other value
                               // means to use this
{
  // should we really subtract out min-loss?
  // float min_loss = FLT_MAX;
  if (priv.cb_learner)
  {
    if (min_loss == FLT_MAX)
      for (size_t i = 0; i < losses.cb.costs.size(); i++) min_loss = MIN(min_loss, losses.cb.costs[i].cost);
    for (size_t i = 0; i < losses.cb.costs.size(); i++) losses.cb.costs[i].cost = losses.cb.costs[i].cost - min_loss;
  }
  else
  {
    if (min_loss == FLT_MAX)
      for (size_t i = 0; i < losses.cs.costs.size(); i++) min_loss = MIN(min_loss, losses.cs.costs[i].x);
    for (size_t i = 0; i < losses.cs.costs.size(); i++)
      losses.cs.costs[i].x = (losses.cs.costs[i].x - min_loss) * weight;
  }
  // cerr << "losses = ["; for (size_t i=0; i<losses.cs.costs.size(); i++) cerr << ' ' << losses.cs.costs[i].class_index
  // << ':' << losses.cs.costs[i].x; cerr << " ]" << endl;

  if (!priv.is_ldf)  // not LDF
  {
    // since we're not LDF, it should be the case that ec_ref_cnt == 1
    // and learn_ec_ref[0] is a pointer to a single example
    assert(priv.learn_ec_ref_cnt == 1);
    assert(priv.learn_ec_ref != nullptr);

    example& ec = priv.learn_ec_ref[0];
    polylabel old_label = ec.l;
    ec.l = losses;  // labels;
    if (add_conditioning)
      add_example_conditioning(priv, ec, priv.learn_condition_on.size(), priv.learn_condition_on_names.begin(),
          priv.learn_condition_on_act.begin());
    for (size_t is_local = 0; is_local <= (size_t)priv.xv; is_local++)
    {
      int learner = select_learner(priv, priv.current_policy, priv.learn_learner_id, true, is_local > 0);
      ec.in_use = true;
      cdbg << "BEGIN base_learner->learn(ec, " << learner << ")" << endl;
      as_singleline(priv.base_learner)->learn(ec, learner);
      cdbg << "END   base_learner->learn(ec, " << learner << ")" << endl;
    }
    if (add_conditioning)
      del_example_conditioning(priv, ec);
    ec.l = old_label;
    priv.total_examples_generated++;
  }
  else  // is  LDF
  {
    assert(cs_get_costs_size(priv.cb_learner, losses) == priv.learn_ec_ref_cnt);
    size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(priv.learn_ec_ref[0])) ? 1 : 0;

    // TODO: weight
    if (add_conditioning)
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        add_example_conditioning(priv, ec, priv.learn_condition_on.size(), priv.learn_condition_on_names.begin(),
            priv.learn_condition_on_act.begin());
      }

    for (size_t is_local = 0; is_local <= (size_t)priv.xv; is_local++)
    {
      int learner = select_learner(priv, priv.current_policy, priv.learn_learner_id, true, is_local > 0);

      // create an example collection for

      multi_ex tmp;
      uint64_t tmp_offset = 0;
      if (priv.learn_ec_ref_cnt > start_K)
        tmp_offset = priv.learn_ec_ref[start_K].ft_offset;
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        CS::label& lab = ec.l.cs;
        if (lab.costs.size() == 0)
        {
          CS::wclass wc = {0., a - (uint32_t)start_K, 0., 0.};
          lab.costs.push_back(wc);
        }
        lab.costs[0].x = losses.cs.costs[a - start_K].x;
        ec.in_use = true;
        // store the offset to restore it later
        ec.ft_offset = priv.offset;
        // create the example collection used to learn
        tmp.push_back(&ec);
        cdbg << "generate_training_example called learn on action a=" << a << ", costs.size=" << lab.costs.size()
             << " ec=" << &ec << endl;
        priv.total_examples_generated++;
      }

      // learn with the multiline example
      as_multiline(priv.base_learner)->learn(tmp, learner);

      // restore the offsets in examples
      int i = 0;
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++, i++)
        priv.learn_ec_ref[a].ft_offset = tmp_offset;
    }

    if (add_conditioning)
      for (action a = (uint32_t)start_K; a < priv.learn_ec_ref_cnt; a++)
      {
        example& ec = priv.learn_ec_ref[a];
        del_example_conditioning(priv, ec);
      }
  }
}